

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O2

int __thiscall CVmObjDict::getp_add(CVmObjDict *this,vm_obj_id_t self,vm_val_t *val,uint *argc)

{
  CVmObjPageEntry *pCVar1;
  vm_prop_id_t prop;
  int iVar2;
  vm_obj_id_t obj;
  long lVar3;
  char *pcVar4;
  int idx;
  vm_val_t str_val;
  vm_val_t ele_val;
  
  if ((getp_add(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getp_add(unsigned_int,vm_val_t*,unsigned_int*)::desc), iVar2 != 0
     )) {
    getp_add::desc.min_argc_ = 3;
    getp_add::desc.opt_argc_ = 0;
    getp_add::desc.varargs_ = 0;
    __cxa_guard_release(&getp_add(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc(val,argc,&getp_add::desc);
  if (iVar2 != 0) {
    return 1;
  }
  obj = CVmBif::pop_obj_val();
  str_val.typ = sp_[-1].typ;
  str_val._4_4_ = *(undefined4 *)&sp_[-1].field_0x4;
  str_val.val = sp_[-1].val;
  sp_ = sp_ + -1;
  prop = CVmBif::pop_propid_val();
  pCVar1 = G_obj_table_X.pages_[obj >> 0xc] + (obj & 0xfff);
  lVar3 = (**(code **)(*(long *)&G_obj_table_X.pages_[obj >> 0xc][obj & 0xfff].ptr_ + 400))(pCVar1);
  if ((lVar3 != 0) || (lVar3 = (**(code **)(*(long *)&pCVar1->ptr_ + 0x1a8))(pCVar1), lVar3 != 0)) {
    err_throw(0x7da);
  }
  iVar2 = vm_val_t::is_listlike(&str_val);
  if ((iVar2 == 0) || (iVar2 = vm_val_t::ll_length(&str_val), iVar2 < 0)) {
    pcVar4 = vm_val_t::get_as_string(&str_val);
    if (pcVar4 == (char *)0x0) {
LAB_0023c9f4:
      err_throw(0x7e3);
    }
    add_word(this,self,pcVar4,obj,prop);
  }
  else {
    for (idx = 1; idx - iVar2 != 1; idx = idx + 1) {
      vm_val_t::ll_index(&str_val,&ele_val,idx);
      pcVar4 = vm_val_t::get_as_string(&ele_val);
      if (pcVar4 == (char *)0x0) goto LAB_0023c9f4;
      add_word(this,self,pcVar4,obj,prop);
    }
  }
  val->typ = VM_NIL;
  return 1;
}

Assistant:

int CVmObjDict::getp_add(VMG_ vm_obj_id_t self, vm_val_t *val, uint *argc)
{
    vm_obj_id_t obj;
    vm_val_t str_val;
    vm_prop_id_t voc_prop;
    CVmObject *objp;
    int lstcnt;
    const char *str;
    static CVmNativeCodeDesc desc(3);

    /* check arguments */
    if (get_prop_check_argc(val, argc, &desc))
        return TRUE;

    /* pop the object, word string, and property ID arguments */
    obj = CVmBif::pop_obj_val(vmg0_);
    G_stk->pop(&str_val);
    voc_prop = CVmBif::pop_propid_val(vmg0_);

    /* ensure that the object value isn't a string or list */
    objp = vm_objp(vmg_ obj);
    if (objp->get_as_list() != 0 || objp->get_as_string(vmg0_) != 0)
        err_throw(VMERR_OBJ_VAL_REQD);

    /* if the string argument is a list, add each word from the list */
    if (str_val.is_listlike(vmg0_)
        && (lstcnt = str_val.ll_length(vmg0_)) >= 0)
    {
        /* iterate over the list, using 1-based indices */
        for (int idx = 1 ; idx <= lstcnt ; ++idx)
        {
            /* get the next value from the list */
            vm_val_t ele_val;
            str_val.ll_index(vmg_ &ele_val, idx);

            /* get the next string value */
            if ((str = ele_val.get_as_string(vmg0_)) == 0)
                err_throw(VMERR_STRING_VAL_REQD);

            /* set this string */
            add_word(vmg_ self, str, obj, voc_prop);
        }
    }
    else if ((str = str_val.get_as_string(vmg0_)) != 0)
    {
        /* add the string */
        add_word(vmg_ self, str, obj, voc_prop);
    }
    else
    {
        /* string value required */
        err_throw(VMERR_STRING_VAL_REQD);
    }

    /* there's no return value */
    val->set_nil();

    /* success */
    return TRUE;
}